

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::use_program(NegativeTestContext *ctx)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  RenderContext *pRVar3;
  GLuint program;
  GLuint program_00;
  long lVar4;
  deUint32 buf;
  deUint32 tfID;
  ShaderProgram program1;
  char *tfVarying;
  ShaderProgram program2;
  value_type local_2e0;
  value_type local_2c0;
  undefined1 local_2a0 [152];
  GLuint local_208;
  undefined1 local_1d0 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8 [5];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_140;
  undefined1 local_120 [32];
  undefined1 local_100 [176];
  undefined1 local_50 [17];
  undefined8 uStack_3f;
  
  program = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b31);
  program_00 = glu::CallLogWrapper::glCreateProgram(&ctx->super_CallLogWrapper);
  glu::CallLogWrapper::glDeleteProgram(&ctx->super_CallLogWrapper,program_00);
  pcVar1 = local_2a0 + 0x10;
  local_2a0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2a0,
             "GL_INVALID_VALUE is generated if program is neither 0 nor a value generated by OpenGL."
             ,"");
  NegativeTestContext::beginSection(ctx,(string *)local_2a0);
  if ((pointer)local_2a0._0_8_ != pcVar1) {
    operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
  }
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,program_00);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  local_2a0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2a0,
             "GL_INVALID_OPERATION is generated if program is not a program object.","");
  NegativeTestContext::beginSection(ctx,(string *)local_2a0);
  if ((pointer)local_2a0._0_8_ != pcVar1) {
    operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
  }
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,program);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  local_2a0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2a0,
             "GL_INVALID_OPERATION is generated if transform feedback mode is active and not paused."
             ,"");
  NegativeTestContext::beginSection(ctx,(string *)local_2a0);
  if ((pointer)local_2a0._0_8_ != pcVar1) {
    operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
  }
  pRVar3 = ctx->m_renderCtx;
  local_1d0._0_8_ = local_1d0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1d0,
             "#version 300 es\nvoid main (void)\n{\n\tgl_Position = vec4(0.0);\n}\n","");
  paVar2 = &local_2e0.field_2;
  local_2e0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2e0,
             "#version 300 es\nlayout(location = 0) out mediump vec4 fragColor;void main (void)\n{\n\tfragColor = vec4(0.0);\n}\n"
             ,"");
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_100,0,0xac);
  local_50._0_8_ = (pointer)0x0;
  local_50[8] = '\0';
  local_50._9_7_ = 0;
  local_50[0x10] = false;
  uStack_3f = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_100,(value_type *)local_1d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + 0x18),&local_2e0);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_2a0,pRVar3,(ProgramSources *)local_100);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            ((vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
             (local_100 + 0x90));
  lVar4 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + lVar4));
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  pRVar3 = ctx->m_renderCtx;
  local_2e0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2e0,
             "#version 300 es\nvoid main (void)\n{\n\tgl_Position = vec4(0.0);\n}\n","");
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2c0,
             "#version 300 es\nlayout(location = 0) out mediump vec4 fragColor;void main (void)\n{\n\tfragColor = vec4(0.0);\n}\n"
             ,"");
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_1d0,0,0xac);
  local_120._0_8_ = (pointer)0x0;
  local_120[8] = 0;
  local_120._9_7_ = 0;
  local_120[0x10] = 0;
  local_120._17_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1d0,&local_2e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_1b8,&local_2c0);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_100,pRVar3,(ProgramSources *)local_1d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_120);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_140);
  lVar4 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d0 + lVar4));
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  local_2e0._M_dataplus._M_p._0_4_ = 0x1234;
  local_2c0._M_dataplus._M_p._0_4_ = 0x1234;
  local_1d0._0_8_ = "gl_Position";
  glu::CallLogWrapper::glGenTransformFeedbacks(&ctx->super_CallLogWrapper,1,(GLuint *)&local_2c0);
  glu::CallLogWrapper::glGenBuffers(&ctx->super_CallLogWrapper,1,(GLuint *)&local_2e0);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,local_208);
  glu::CallLogWrapper::glTransformFeedbackVaryings
            (&ctx->super_CallLogWrapper,local_208,1,(GLchar **)local_1d0,0x8c8c);
  glu::CallLogWrapper::glLinkProgram(&ctx->super_CallLogWrapper,local_208);
  glu::CallLogWrapper::glBindTransformFeedback
            (&ctx->super_CallLogWrapper,0x8e22,(GLuint)local_2c0._M_dataplus._M_p);
  glu::CallLogWrapper::glBindBuffer
            (&ctx->super_CallLogWrapper,0x8c8e,(GLuint)local_2e0._M_dataplus._M_p);
  glu::CallLogWrapper::glBufferData(&ctx->super_CallLogWrapper,0x8c8e,0x20,(void *)0x0,0x88e8);
  glu::CallLogWrapper::glBindBufferBase
            (&ctx->super_CallLogWrapper,0x8c8e,0,(GLuint)local_2e0._M_dataplus._M_p);
  glu::CallLogWrapper::glBeginTransformFeedback(&ctx->super_CallLogWrapper,4);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,local_100._152_4_);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glPauseTransformFeedback(&ctx->super_CallLogWrapper);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,local_100._152_4_);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glEndTransformFeedback(&ctx->super_CallLogWrapper);
  glu::CallLogWrapper::glDeleteTransformFeedbacks(&ctx->super_CallLogWrapper,1,(GLuint *)&local_2c0)
  ;
  glu::CallLogWrapper::glDeleteBuffers(&ctx->super_CallLogWrapper,1,(GLuint *)&local_2e0);
  NegativeTestContext::expectError(ctx,0);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,0);
  glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,program);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_100);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_2a0);
  return;
}

Assistant:

void use_program (NegativeTestContext& ctx)
{
	GLuint shader = ctx.glCreateShader(GL_VERTEX_SHADER);

	const GLuint notAProgram = ctx.glCreateProgram();
	ctx.glDeleteProgram(notAProgram);

	ctx.beginSection("GL_INVALID_VALUE is generated if program is neither 0 nor a value generated by OpenGL.");
	ctx.glUseProgram(notAProgram);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if program is not a program object.");
	ctx.glUseProgram(shader);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if transform feedback mode is active and not paused.");
	glu::ShaderProgram			program1(ctx.getRenderContext(), glu::makeVtxFragSources(vertexShaderSource, fragmentShaderSource));
	glu::ShaderProgram			program2(ctx.getRenderContext(), glu::makeVtxFragSources(vertexShaderSource, fragmentShaderSource));
	deUint32					buf = 0x1234;
	deUint32					tfID = 0x1234;
	const char* tfVarying		= "gl_Position";

	ctx.glGenTransformFeedbacks		(1, &tfID);
	ctx.glGenBuffers				(1, &buf);

	ctx.glUseProgram				(program1.getProgram());
	ctx.glTransformFeedbackVaryings	(program1.getProgram(), 1, &tfVarying, GL_INTERLEAVED_ATTRIBS);
	ctx.glLinkProgram				(program1.getProgram());
	ctx.glBindTransformFeedback		(GL_TRANSFORM_FEEDBACK, tfID);
	ctx.glBindBuffer				(GL_TRANSFORM_FEEDBACK_BUFFER, buf);
	ctx.glBufferData				(GL_TRANSFORM_FEEDBACK_BUFFER, 32, DE_NULL, GL_DYNAMIC_DRAW);
	ctx.glBindBufferBase			(GL_TRANSFORM_FEEDBACK_BUFFER, 0, buf);
	ctx.glBeginTransformFeedback	(GL_TRIANGLES);
	ctx.expectError					(GL_NO_ERROR);

	ctx.glUseProgram				(program2.getProgram());
	ctx.expectError				(GL_INVALID_OPERATION);

	ctx.glPauseTransformFeedback	();
	ctx.glUseProgram				(program2.getProgram());
	ctx.expectError				(GL_NO_ERROR);

	ctx.glEndTransformFeedback		();
	ctx.glDeleteTransformFeedbacks	(1, &tfID);
	ctx.glDeleteBuffers				(1, &buf);
	ctx.expectError				(GL_NO_ERROR);
	ctx.endSection();

	ctx.glUseProgram(0);
	ctx.glDeleteShader(shader);
}